

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O3

void fdb_file_handle_free(fdb_file_handle *fhandle)

{
  list_elem *plVar1;
  list *__ptr;
  list_elem *e;
  
  free(fhandle->handles);
  __ptr = fhandle->cmp_func_list;
  if (__ptr != (list *)0x0) {
    e = __ptr->head;
    if (__ptr->head != (list_elem *)0x0) {
      do {
        plVar1 = list_remove(fhandle->cmp_func_list,e);
        free(e[-2].next);
        free(&e[-2].next);
        e = plVar1;
      } while (plVar1 != (list_elem *)0x0);
      __ptr = fhandle->cmp_func_list;
    }
    free(__ptr);
    fhandle->cmp_func_list = (list *)0x0;
  }
  pthread_spin_destroy(&fhandle->lock);
  free(fhandle);
  return;
}

Assistant:

void fdb_file_handle_free(fdb_file_handle *fhandle)
{
    free(fhandle->handles);
    _free_cmp_func_list(fhandle);
    spin_destroy(&fhandle->lock);
    free(fhandle);
}